

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTail.cpp
# Opt level: O3

void __thiscall liblogger::LogTail::Log(LogTail *this,LogType Type,string *str)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t *psVar1;
  _Node *p_Var2;
  
  LogManager::Lock();
  this_00 = &this->m_data;
  if (this->m_length <=
      (this->m_data).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(this_00,(this_00->
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl._M_node.super__List_node_base._M_next);
  }
  p_Var2 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           _M_create_node<std::__cxx11::string_const&>
                     ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,str
                     );
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->m_data).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  LogManager::Unlock();
  return;
}

Assistant:

void LogTail::Log(const LogType Type, const std::string &str) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	if (m_data.size() >= m_length)
		m_data.pop_front();
	m_data.push_back(str);
}